

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase726::run(TestCase726 *this)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  SourceLocation location_04;
  SourceLocation location_05;
  SourceLocation location_06;
  SourceLocation location_07;
  SourceLocation location_08;
  SourceLocation location_09;
  SourceLocation location_10;
  SourceLocation location_11;
  SourceLocation location_12;
  SourceLocation location_13;
  SourceLocation location_14;
  SourceLocation location_15;
  SourceLocation location_16;
  bool bVar1;
  kj *pkVar2;
  Promise<int> *pPVar3;
  NullableValue<kj::Exception> *other;
  Exception *pEVar4;
  Promise<NoCopy> *pPVar5;
  char *pcVar6;
  anon_class_24_3_ea6982ff *func;
  undefined4 in_stack_ffffffffffffedd0;
  uint in_stack_ffffffffffffedd4;
  SourceLocation local_10c0;
  SourceLocation local_10a0;
  Array<kj::Promise<NoCopy>_> local_1088;
  undefined1 local_1070 [22];
  bool local_105a;
  undefined1 auStack_1058 [6];
  bool _kj_shouldLog_8;
  Promise<NoCopy> *local_1048;
  SourceLocation local_1038;
  Array<kj::Promise<NoCopy>_> local_1020;
  undefined1 local_1008 [20];
  DebugExpression<int> local_ff4;
  undefined1 local_ff0 [8];
  DebugComparison<int,_int> _kjCondition_7;
  undefined1 local_fc8 [24];
  undefined1 local_fb0 [8];
  PromiseFulfillerPair<NoCopy> right_7;
  undefined1 local_f90 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:819:27),_void>
  left_7;
  WaitScope waitScope_7;
  EventLoop loop_7;
  bool _kj_shouldLog_7;
  undefined4 uStack_ee8;
  bool _kj_shouldLog_6;
  DebugExpression<kj::Exception::Type> local_ee4;
  undefined1 local_ee0 [8];
  DebugComparison<kj::Exception::Type,_kj::Exception::Type> _kjCondition_6;
  Exception *e;
  undefined8 local_eb0;
  undefined8 local_ea8;
  Maybe<kj::Exception> local_ea0;
  undefined1 local_d08 [8];
  NullableValue<kj::Exception> _e802;
  undefined1 local_b68 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:798:28),_void>
  right_6;
  undefined1 local_b58 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:795:27),_void>
  left_6;
  WaitScope waitScope_6;
  EventLoop loop_6;
  SourceLocation local_ab0;
  SourceLocation local_a90;
  Array<kj::Promise<int>_> local_a78;
  Array<kj::Promise<int>_> local_a60;
  undefined1 auStack_a48 [6];
  bool _kj_shouldLog_5;
  char *local_a38;
  SourceLocation local_a28;
  Array<kj::Promise<int>_> local_a10;
  undefined1 local_9f8 [24];
  undefined1 local_9e0 [8];
  DebugComparison<int,_int> _kjCondition_5;
  undefined1 local_9b8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:786:28),_void>
  right_5;
  undefined1 local_9a8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:783:27),_void>
  left_5;
  WaitScope waitScope_5;
  EventLoop loop_5;
  SourceLocation local_900;
  SourceLocation local_8e0;
  Array<kj::Promise<int>_> local_8c8;
  Array<kj::Promise<int>_> local_8b0;
  undefined1 auStack_898 [6];
  bool _kj_shouldLog_4;
  undefined8 local_888;
  SourceLocation local_878;
  Array<kj::Promise<int>_> local_860;
  undefined1 local_848 [24];
  undefined1 local_830 [8];
  DebugComparison<int,_int> _kjCondition_4;
  undefined1 local_808 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:773:28),_void>
  right_4;
  undefined1 local_7f8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:772:27),_void>
  left_4;
  WaitScope waitScope_4;
  EventLoop loop_4;
  SourceLocation local_750;
  SourceLocation local_730;
  Array<kj::Promise<int>_> local_718;
  Array<kj::Promise<int>_> local_700;
  undefined1 auStack_6e8 [6];
  bool _kj_shouldLog_3;
  undefined8 local_6d8;
  SourceLocation local_6c8;
  Array<kj::Promise<int>_> local_6b0;
  undefined1 local_698 [24];
  undefined1 local_680 [8];
  DebugComparison<int,_int> _kjCondition_3;
  SourceLocation local_658;
  Type local_639;
  undefined1 local_638 [16];
  Promise<int> right_3;
  undefined1 local_620 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:762:27),_void>
  left_3;
  WaitScope waitScope_3;
  EventLoop loop_3;
  SourceLocation local_578;
  SourceLocation local_558;
  Array<kj::Promise<int>_> local_540;
  Array<kj::Promise<int>_> local_528;
  undefined1 auStack_510 [6];
  bool _kj_shouldLog_2;
  char *local_500;
  SourceLocation local_4f0;
  Array<kj::Promise<int>_> local_4d8;
  undefined1 local_4c0 [20];
  DebugExpression<int> local_4ac;
  undefined1 local_4a8 [8];
  DebugComparison<int,_int> _kjCondition_2;
  undefined1 local_480 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:753:28),_void>
  right_2;
  undefined1 local_470 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:752:27),_void>
  left_2;
  WaitScope waitScope_2;
  EventLoop loop_2;
  SourceLocation local_3c8;
  SourceLocation local_3a8;
  Array<kj::Promise<int>_> local_390;
  Array<kj::Promise<int>_> local_378;
  undefined1 auStack_360 [6];
  bool _kj_shouldLog_1;
  undefined8 local_350;
  SourceLocation local_340;
  Array<kj::Promise<int>_> local_328;
  undefined1 local_310 [24];
  undefined1 local_2f8 [8];
  DebugComparison<int,_int> _kjCondition_1;
  undefined1 local_2d0 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:743:28),_void>
  right_1;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [8];
  PromiseFulfillerPair<int> left_1;
  WaitScope waitScope_1;
  EventLoop loop_1;
  SourceLocation local_1f0;
  SourceLocation local_1d0;
  Array<kj::Promise<int>_> local_1b8;
  Array<kj::Promise<int>_> local_1a0;
  undefined1 auStack_188 [6];
  bool _kj_shouldLog;
  char *local_178;
  SourceLocation local_168;
  Array<kj::Promise<int>_> local_150;
  undefined1 local_138 [24];
  undefined1 local_120 [8];
  DebugComparison<int,_int> _kjCondition;
  SourceLocation local_f8;
  undefined1 local_e0 [8];
  PromiseFulfillerPair<int> right;
  undefined1 local_c0 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:731:27),_void>
  left;
  WaitScope waitScope;
  EventLoop loop;
  TestCase726 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope
            ((WaitScope *)&stack0xffffffffffffff58,(EventLoop *)&waitScope.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__0>
            ((kj *)local_c0,(Type *)((long)&right.fulfiller.ptr + 7));
  SourceLocation::SourceLocation
            (&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2dc,0x12);
  location_14.function = (char *)local_f8._16_8_;
  location_14.fileName = local_f8.function;
  location_14.lineNumber = in_stack_ffffffffffffedd0;
  location_14.columnNumber = in_stack_ffffffffffffedd4;
  newPromiseAndFulfiller<int>(location_14);
  local_138._16_4_ = 0x7b;
  local_138._20_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_138 + 0x10));
  pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_c0);
  pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_e0);
  arr<kj::Promise<int>,kj::Promise<int>>(&local_150,pkVar2,pPVar3,(Promise<int> *)local_f8._16_8_);
  SourceLocation::SourceLocation
            (&local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2df,0x28);
  location.function = local_168.function;
  location.fileName = local_168.fileName;
  location.lineNumber = local_168.lineNumber;
  location.columnNumber = local_168.columnNumber;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)local_138,location);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2df,0x28);
  local_138._12_4_ = Promise<int>::wait((Promise<int> *)local_138,&stack0xffffffffffffff58);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_120,(DebugExpression<int> *)(local_138 + 0x14),
             (int *)(local_138 + 0xc));
  Promise<int>::~Promise((Promise<int> *)local_138);
  Array<kj::Promise<int>_>::~Array(&local_150);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_120);
  if (!bVar1) {
    local_1a0.disposer._6_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)local_1a0.disposer._6_1_ != false) {
      local_1a0.disposer._0_4_ = 0x7b;
      pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_c0);
      pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_e0);
      arr<kj::Promise<int>,kj::Promise<int>>(&local_1b8,pkVar2,pPVar3,(Promise<int> *)local_178);
      SourceLocation::SourceLocation
                (&local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x2df,0x28);
      location_00.function = local_1d0.function;
      location_00.fileName = local_1d0.fileName;
      location_00.lineNumber = local_1d0.lineNumber;
      location_00.columnNumber = local_1d0.columnNumber;
      raceSuccessful<int>(&local_1a0,location_00);
      SourceLocation::SourceLocation
                (&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x2df,0x28);
      local_1a0.size_._4_4_ =
           Promise<int>::wait((Promise<int> *)&local_1a0,&stack0xffffffffffffff58);
      local_178 = 
      "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope)"
      ;
      kj::_::Debug::log<char_const(&)[106],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2df,ERROR,
                 "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope)"
                 ,(char (*) [106])
                  "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))"
                 ,(DebugComparison<int,_int> *)local_120,(int *)&local_1a0.disposer,
                 (int *)((long)&local_1a0.size_ + 4));
      Promise<int>::~Promise((Promise<int> *)&local_1a0);
      Array<kj::Promise<int>_>::~Array(&local_1b8);
      local_1a0.disposer._6_1_ = false;
    }
  }
  PromiseFulfillerPair<int>::~PromiseFulfillerPair((PromiseFulfillerPair<int> *)local_e0);
  Promise<int>::~Promise((Promise<int> *)local_c0);
  WaitScope::~WaitScope((WaitScope *)&stack0xffffffffffffff58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  EventLoop::EventLoop((EventLoop *)&waitScope_1.runningStacksPool);
  WaitScope::WaitScope
            ((WaitScope *)&left_1.fulfiller.ptr,(EventLoop *)&waitScope_1.runningStacksPool);
  SourceLocation::SourceLocation
            ((SourceLocation *)&stack0xfffffffffffffd40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2e6,0x11);
  location_15.function = (char *)local_2b0;
  location_15.fileName = (char *)uStack_2b8;
  location_15.lineNumber = in_stack_ffffffffffffedd0;
  location_15.columnNumber = in_stack_ffffffffffffedd4;
  newPromiseAndFulfiller<int>(location_15);
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__1>
            ((kj *)local_2d0,(Type *)&_kjCondition_1.field_0x1f);
  local_310._16_4_ = 0x7b;
  local_310._20_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_310 + 0x10));
  pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_2a8);
  pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_2d0);
  arr<kj::Promise<int>,kj::Promise<int>>(&local_328,pkVar2,pPVar3,(Promise<int> *)local_2b0);
  SourceLocation::SourceLocation
            (&local_340,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2e9,0x60);
  location_01.function = local_340.function;
  location_01.fileName = local_340.fileName;
  location_01.lineNumber = local_340.lineNumber;
  location_01.columnNumber = local_340.columnNumber;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)local_310,location_01);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_360,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2e9,0x60);
  local_310._12_4_ = Promise<int>::wait((Promise<int> *)local_310,&left_1.fulfiller.ptr);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_2f8,(DebugExpression<int> *)(local_310 + 0x14),
             (int *)(local_310 + 0xc));
  Promise<int>::~Promise((Promise<int> *)local_310);
  Array<kj::Promise<int>_>::~Array(&local_328);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2f8);
  pcVar6 = (char *)local_350;
  if (!bVar1) {
    local_378.disposer._6_1_ = kj::_::Debug::shouldLog(ERROR);
    pcVar6 = (char *)local_350;
    while ((bool)local_378.disposer._6_1_ != false) {
      local_378.disposer._0_4_ = 0x7b;
      pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_2a8);
      pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_2d0);
      arr<kj::Promise<int>,kj::Promise<int>>(&local_390,pkVar2,pPVar3,(Promise<int> *)pcVar6);
      SourceLocation::SourceLocation
                (&local_3a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x2e9,0x60);
      location_02.function = local_3a8.function;
      location_02.fileName = local_3a8.fileName;
      location_02.lineNumber = local_3a8.lineNumber;
      location_02.columnNumber = local_3a8.columnNumber;
      raceSuccessful<int>(&local_378,location_02);
      SourceLocation::SourceLocation
                (&local_3c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x2e9,0x60);
      local_378.size_._4_4_ = Promise<int>::wait((Promise<int> *)&local_378,&left_1.fulfiller.ptr);
      pcVar6 = 
      "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope)"
      ;
      kj::_::Debug::log<char_const(&)[105],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2e9,ERROR,
                 "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope)"
                 ,(char (*) [105])
                  "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))"
                 ,(DebugComparison<int,_int> *)local_2f8,(int *)&local_378.disposer,
                 (int *)((long)&local_378.size_ + 4));
      Promise<int>::~Promise((Promise<int> *)&local_378);
      Array<kj::Promise<int>_>::~Array(&local_390);
      local_378.disposer._6_1_ = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)local_2d0);
  PromiseFulfillerPair<int>::~PromiseFulfillerPair((PromiseFulfillerPair<int> *)local_2a8);
  WaitScope::~WaitScope((WaitScope *)&left_1.fulfiller.ptr);
  EventLoop::~EventLoop((EventLoop *)&waitScope_1.runningStacksPool);
  EventLoop::EventLoop((EventLoop *)&waitScope_2.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)&left_2,(EventLoop *)&waitScope_2.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__2>
            ((kj *)local_470,(Type *)((long)&right_2.super_PromiseBase.node.ptr + 7));
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__3>
            ((kj *)local_480,(Type *)&_kjCondition_2.field_0x1f);
  local_4c0._16_4_ = 0x7b;
  local_4ac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_4c0 + 0x10));
  pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_470);
  pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_480);
  arr<kj::Promise<int>,kj::Promise<int>>(&local_4d8,pkVar2,pPVar3,(Promise<int> *)pcVar6);
  SourceLocation::SourceLocation
            (&local_4f0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2f3,0x58);
  location_03.function = local_4f0.function;
  location_03.fileName = local_4f0.fileName;
  location_03.lineNumber = local_4f0.lineNumber;
  location_03.columnNumber = local_4f0.columnNumber;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)local_4c0,location_03);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_510,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2f3,0x58);
  local_4c0._12_4_ = Promise<int>::wait((Promise<int> *)local_4c0,&left_2);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_4a8,&local_4ac,(int *)(local_4c0 + 0xc));
  Promise<int>::~Promise((Promise<int> *)local_4c0);
  Array<kj::Promise<int>_>::~Array(&local_4d8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4a8);
  if (!bVar1) {
    local_528.disposer._6_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)local_528.disposer._6_1_ != false) {
      local_528.disposer._0_4_ = 0x7b;
      pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_470);
      pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_480);
      arr<kj::Promise<int>,kj::Promise<int>>(&local_540,pkVar2,pPVar3,(Promise<int> *)local_500);
      SourceLocation::SourceLocation
                (&local_558,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x2f3,0x58);
      location_04.function = local_558.function;
      location_04.fileName = local_558.fileName;
      location_04.lineNumber = local_558.lineNumber;
      location_04.columnNumber = local_558.columnNumber;
      raceSuccessful<int>(&local_528,location_04);
      SourceLocation::SourceLocation
                (&local_578,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x2f3,0x58);
      local_528.size_._4_4_ = Promise<int>::wait((Promise<int> *)&local_528,&left_2);
      local_500 = 
      "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
      ;
      kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2f3,ERROR,
                 "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
                 ,(char (*) [97])
                  "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
                 ,(DebugComparison<int,_int> *)local_4a8,(int *)&local_528.disposer,
                 (int *)((long)&local_528.size_ + 4));
      Promise<int>::~Promise((Promise<int> *)&local_528);
      Array<kj::Promise<int>_>::~Array(&local_540);
      local_528.disposer._6_1_ = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)local_480);
  Promise<int>::~Promise((Promise<int> *)local_470);
  WaitScope::~WaitScope((WaitScope *)&left_2);
  EventLoop::~EventLoop((EventLoop *)&waitScope_2.runningStacksPool);
  EventLoop::EventLoop((EventLoop *)&waitScope_3.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)&left_3,(EventLoop *)&waitScope_3.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__4>
            ((kj *)local_620,(Type *)((long)&right_3.super_PromiseBase.node.ptr + 7));
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__5>((kj *)local_638,&local_639);
  SourceLocation::SourceLocation
            (&local_658,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2fb,0x12);
  location_05.function = local_658.function;
  location_05.fileName = local_658.fileName;
  location_05.lineNumber = local_658.lineNumber;
  location_05.columnNumber = local_658.columnNumber;
  Promise<int>::eagerlyEvaluate((Promise<int> *)(local_638 + 8),local_638,location_05);
  Promise<int>::~Promise((Promise<int> *)local_638);
  local_698._16_4_ = 0x1c8;
  local_698._20_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_698 + 0x10));
  pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_620);
  pPVar3 = mv<kj::Promise<int>>((Promise<int> *)(local_638 + 8));
  arr<kj::Promise<int>,kj::Promise<int>>(&local_6b0,pkVar2,pPVar3,(Promise<int> *)local_658._16_8_);
  SourceLocation::SourceLocation
            (&local_6c8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2fd,0x58);
  location_06.function = local_6c8.function;
  location_06.fileName = local_6c8.fileName;
  location_06.lineNumber = local_6c8.lineNumber;
  location_06.columnNumber = local_6c8.columnNumber;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)local_698,location_06);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_6e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x2fd,0x58);
  local_698._12_4_ = Promise<int>::wait((Promise<int> *)local_698,&left_3);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_680,(DebugExpression<int> *)(local_698 + 0x14),
             (int *)(local_698 + 0xc));
  Promise<int>::~Promise((Promise<int> *)local_698);
  Array<kj::Promise<int>_>::~Array(&local_6b0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_680);
  pcVar6 = (char *)local_6d8;
  if (!bVar1) {
    local_700.disposer._6_1_ = kj::_::Debug::shouldLog(ERROR);
    pcVar6 = (char *)local_6d8;
    while ((bool)local_700.disposer._6_1_ != false) {
      local_700.disposer._0_4_ = 0x1c8;
      pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_620);
      pPVar3 = mv<kj::Promise<int>>((Promise<int> *)(local_638 + 8));
      arr<kj::Promise<int>,kj::Promise<int>>(&local_718,pkVar2,pPVar3,(Promise<int> *)pcVar6);
      SourceLocation::SourceLocation
                (&local_730,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x2fd,0x58);
      location_07.function = local_730.function;
      location_07.fileName = local_730.fileName;
      location_07.lineNumber = local_730.lineNumber;
      location_07.columnNumber = local_730.columnNumber;
      raceSuccessful<int>(&local_700,location_07);
      SourceLocation::SourceLocation
                (&local_750,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x2fd,0x58);
      local_700.size_._4_4_ = Promise<int>::wait((Promise<int> *)&local_700,&left_3);
      pcVar6 = 
      "\"failed: expected \" \"(456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
      ;
      kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2fd,ERROR,
                 "\"failed: expected \" \"(456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
                 ,(char (*) [97])
                  "failed: expected (456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
                 ,(DebugComparison<int,_int> *)local_680,(int *)&local_700.disposer,
                 (int *)((long)&local_700.size_ + 4));
      Promise<int>::~Promise((Promise<int> *)&local_700);
      Array<kj::Promise<int>_>::~Array(&local_718);
      local_700.disposer._6_1_ = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)(local_638 + 8));
  Promise<int>::~Promise((Promise<int> *)local_620);
  WaitScope::~WaitScope((WaitScope *)&left_3);
  EventLoop::~EventLoop((EventLoop *)&waitScope_3.runningStacksPool);
  EventLoop::EventLoop((EventLoop *)&waitScope_4.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)&left_4,(EventLoop *)&waitScope_4.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__6>
            ((kj *)local_7f8,(Type *)((long)&right_4.super_PromiseBase.node.ptr + 7));
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__7>
            ((kj *)local_808,(Type *)&_kjCondition_4.field_0x1f);
  local_848._16_4_ = 0x7b;
  local_848._20_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_848 + 0x10));
  pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_7f8);
  pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_808);
  arr<kj::Promise<int>,kj::Promise<int>>(&local_860,pkVar2,pPVar3,(Promise<int> *)pcVar6);
  SourceLocation::SourceLocation
            (&local_878,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x309,0x58);
  location_08.function = local_878.function;
  location_08.fileName = local_878.fileName;
  location_08.lineNumber = local_878.lineNumber;
  location_08.columnNumber = local_878.columnNumber;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)local_848,location_08);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_898,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x309,0x58);
  local_848._12_4_ = Promise<int>::wait((Promise<int> *)local_848,&left_4);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_830,(DebugExpression<int> *)(local_848 + 0x14),
             (int *)(local_848 + 0xc));
  Promise<int>::~Promise((Promise<int> *)local_848);
  Array<kj::Promise<int>_>::~Array(&local_860);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_830);
  pcVar6 = (char *)local_888;
  if (!bVar1) {
    local_8b0.disposer._6_1_ = kj::_::Debug::shouldLog(ERROR);
    pcVar6 = (char *)local_888;
    while ((bool)local_8b0.disposer._6_1_ != false) {
      local_8b0.disposer._0_4_ = 0x7b;
      pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_7f8);
      pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_808);
      arr<kj::Promise<int>,kj::Promise<int>>(&local_8c8,pkVar2,pPVar3,(Promise<int> *)pcVar6);
      SourceLocation::SourceLocation
                (&local_8e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x309,0x58);
      location_09.function = local_8e0.function;
      location_09.fileName = local_8e0.fileName;
      location_09.lineNumber = local_8e0.lineNumber;
      location_09.columnNumber = local_8e0.columnNumber;
      raceSuccessful<int>(&local_8b0,location_09);
      SourceLocation::SourceLocation
                (&local_900,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x309,0x58);
      local_8b0.size_._4_4_ = Promise<int>::wait((Promise<int> *)&local_8b0,&left_4);
      pcVar6 = 
      "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
      ;
      kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x309,ERROR,
                 "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
                 ,(char (*) [97])
                  "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
                 ,(DebugComparison<int,_int> *)local_830,(int *)&local_8b0.disposer,
                 (int *)((long)&local_8b0.size_ + 4));
      Promise<int>::~Promise((Promise<int> *)&local_8b0);
      Array<kj::Promise<int>_>::~Array(&local_8c8);
      local_8b0.disposer._6_1_ = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)local_808);
  Promise<int>::~Promise((Promise<int> *)local_7f8);
  WaitScope::~WaitScope((WaitScope *)&left_4);
  EventLoop::~EventLoop((EventLoop *)&waitScope_4.runningStacksPool);
  EventLoop::EventLoop((EventLoop *)&waitScope_5.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)&left_5,(EventLoop *)&waitScope_5.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__8>
            ((kj *)local_9a8,(Type *)((long)&right_5.super_PromiseBase.node.ptr + 7));
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__9>
            ((kj *)local_9b8,(Type *)&_kjCondition_5.field_0x1f);
  local_9f8._16_4_ = 0x7b;
  local_9f8._20_4_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_9f8 + 0x10));
  pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_9a8);
  pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_9b8);
  arr<kj::Promise<int>,kj::Promise<int>>(&local_a10,pkVar2,pPVar3,(Promise<int> *)pcVar6);
  SourceLocation::SourceLocation
            (&local_a28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x314,0x58);
  location_10.function = local_a28.function;
  location_10.fileName = local_a28.fileName;
  location_10.lineNumber = local_a28.lineNumber;
  location_10.columnNumber = local_a28.columnNumber;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)local_9f8,location_10);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_a48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x314,0x58);
  local_9f8._12_4_ = Promise<int>::wait((Promise<int> *)local_9f8,&left_5);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_9e0,(DebugExpression<int> *)(local_9f8 + 0x14),
             (int *)(local_9f8 + 0xc));
  Promise<int>::~Promise((Promise<int> *)local_9f8);
  Array<kj::Promise<int>_>::~Array(&local_a10);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_9e0);
  if (!bVar1) {
    local_a60.disposer._6_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)local_a60.disposer._6_1_ != false) {
      local_a60.disposer._0_4_ = 0x7b;
      pkVar2 = (kj *)mv<kj::Promise<int>>((Promise<int> *)local_9a8);
      pPVar3 = mv<kj::Promise<int>>((Promise<int> *)local_9b8);
      arr<kj::Promise<int>,kj::Promise<int>>(&local_a78,pkVar2,pPVar3,(Promise<int> *)local_a38);
      SourceLocation::SourceLocation
                (&local_a90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x314,0x58);
      location_11.function = local_a90.function;
      location_11.fileName = local_a90.fileName;
      location_11.lineNumber = local_a90.lineNumber;
      location_11.columnNumber = local_a90.columnNumber;
      raceSuccessful<int>(&local_a60,location_11);
      SourceLocation::SourceLocation
                (&local_ab0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x314,0x58);
      local_a60.size_._4_4_ = Promise<int>::wait((Promise<int> *)&local_a60,&left_5);
      local_a38 = 
      "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
      ;
      kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x314,ERROR,
                 "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
                 ,(char (*) [97])
                  "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
                 ,(DebugComparison<int,_int> *)local_9e0,(int *)&local_a60.disposer,
                 (int *)((long)&local_a60.size_ + 4));
      Promise<int>::~Promise((Promise<int> *)&local_a60);
      Array<kj::Promise<int>_>::~Array(&local_a78);
      local_a60.disposer._6_1_ = false;
    }
  }
  Promise<int>::~Promise((Promise<int> *)local_9b8);
  Promise<int>::~Promise((Promise<int> *)local_9a8);
  WaitScope::~WaitScope((WaitScope *)&left_5);
  EventLoop::~EventLoop((EventLoop *)&waitScope_5.runningStacksPool);
  EventLoop::EventLoop((EventLoop *)&waitScope_6.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)&left_6,(EventLoop *)&waitScope_6.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__10>
            ((kj *)local_b58,(Type *)((long)&right_6.super_PromiseBase.node.ptr + 7));
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__11>
            ((kj *)local_b68,(Type *)((long)&_e802.field_1.value.details.builder.disposer + 7));
  e = (Exception *)local_b58;
  local_eb0 = local_b68;
  local_ea8 = &left_6;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase726::run()::__12>
            (&local_ea0,(kj *)&e,func);
  other = kj::_::readMaybe<kj::Exception>(&local_ea0);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_d08,other);
  Maybe<kj::Exception>::~Maybe(&local_ea0);
  pEVar4 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_d08);
  if (pEVar4 == (Exception *)0x0) {
    loop_7.currentlyFiring._2_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)loop_7.currentlyFiring._2_1_ != false) {
      kj::_::Debug::log<char_const(&)[89]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x322,ERROR,
                 "\"code did not throw: \" \"raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)\""
                 ,(char (*) [89])
                  "code did not throw: raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
                );
      loop_7.currentlyFiring._2_1_ = false;
    }
  }
  else {
    _kjCondition_6._24_8_ =
         kj::_::NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_d08);
    uStack_ee8 = Exception::getType((Exception *)_kjCondition_6._24_8_);
    local_ee4 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffff118);
    loop_7.currentlyFiring._4_4_ = 0;
    kj::_::DebugExpression<kj::Exception::Type>::operator==
              ((DebugComparison<kj::Exception::Type,_kj::Exception::Type> *)local_ee0,&local_ee4,
               (Type *)((long)&loop_7.currentlyFiring + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ee0);
    if (!bVar1) {
      loop_7.currentlyFiring._3_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)loop_7.currentlyFiring._3_1_ != false) {
        kj::_::Debug::
        log<char_const(&)[62],kj::_::DebugComparison<kj::Exception::Type,kj::Exception::Type>&,char_const(&)[102],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                   ,0x322,ERROR,
                   "\"failed: expected \" \"e.getType() == ::kj::Exception::Type::FAILED\", _kjCondition, \"code threw wrong exception type: \" \"raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)\", e"
                   ,(char (*) [62])"failed: expected e.getType() == ::kj::Exception::Type::FAILED",
                   (DebugComparison<kj::Exception::Type,_kj::Exception::Type> *)local_ee0,
                   (char (*) [102])
                   "code threw wrong exception type: raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
                   ,(Exception *)_kjCondition_6._24_8_);
        loop_7.currentlyFiring._3_1_ = false;
      }
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_d08);
  Promise<int>::~Promise((Promise<int> *)local_b68);
  Promise<int>::~Promise((Promise<int> *)local_b58);
  WaitScope::~WaitScope((WaitScope *)&left_6);
  EventLoop::~EventLoop((EventLoop *)&waitScope_6.runningStacksPool);
  EventLoop::EventLoop((EventLoop *)&waitScope_7.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)&left_7,(EventLoop *)&waitScope_7.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase726::run()::__13>
            ((kj *)local_f90,(Type *)((long)&right_7.fulfiller.ptr + 7));
  SourceLocation::SourceLocation
            ((SourceLocation *)local_fc8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x334,0x2e);
  location_16.function = (char *)local_fc8._16_8_;
  location_16.fileName = (char *)local_fc8._8_8_;
  location_16.lineNumber = in_stack_ffffffffffffedd0;
  location_16.columnNumber = in_stack_ffffffffffffedd4;
  newPromiseAndFulfiller<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>(location_16);
  local_1008._16_4_ = 0x7b;
  local_ff4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(int *)(local_1008 + 0x10));
  pkVar2 = (kj *)mv<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
                           ((Promise<NoCopy> *)local_f90);
  pPVar5 = mv<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
                     ((Promise<NoCopy> *)local_fb0);
  arr<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>,kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
            (&local_1020,pkVar2,pPVar5,(Promise<NoCopy> *)local_fc8._16_8_);
  SourceLocation::SourceLocation
            (&local_1038,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x337,0x2a);
  location_12.function = local_1038.function;
  location_12.fileName = local_1038.fileName;
  location_12.lineNumber = local_1038.lineNumber;
  location_12.columnNumber = local_1038.columnNumber;
  raceSuccessful<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
            ((Array<kj::Promise<NoCopy>_> *)local_1008,location_12);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_1058,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x337,0x2a);
  local_1008._12_4_ = Promise<NoCopy>::wait((Promise<NoCopy> *)local_1008,&left_7);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_ff0,&local_ff4,(int *)(local_1008 + 0xc));
  Promise<NoCopy>::~Promise((Promise<NoCopy> *)local_1008);
  Array<kj::Promise<NoCopy>_>::~Array(&local_1020);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_ff0);
  if (!bVar1) {
    local_105a = kj::_::Debug::shouldLog(ERROR);
    while (local_105a != false) {
      local_1070._16_4_ = 0x7b;
      pkVar2 = (kj *)mv<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
                               ((Promise<NoCopy> *)local_f90);
      pPVar5 = mv<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
                         ((Promise<NoCopy> *)local_fb0);
      arr<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>,kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
                (&local_1088,pkVar2,pPVar5,local_1048);
      SourceLocation::SourceLocation
                (&local_10a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x337,0x2a);
      location_13.function = local_10a0.function;
      location_13.fileName = local_10a0.fileName;
      location_13.lineNumber = local_10a0.lineNumber;
      location_13.columnNumber = local_10a0.columnNumber;
      raceSuccessful<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
                ((Array<kj::Promise<NoCopy>_> *)local_1070,location_13);
      SourceLocation::SourceLocation
                (&local_10c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0x337,0x2a);
      local_1070._12_4_ = Promise<NoCopy>::wait((Promise<NoCopy> *)local_1070,&left_7);
      local_1048 = (Promise<NoCopy> *)0x8f45b2;
      kj::_::Debug::log<char_const(&)[108],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x337,ERROR,
                 "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i)\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i"
                 ,(char (*) [108])
                  "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i)"
                 ,(DebugComparison<int,_int> *)local_ff0,(int *)(local_1070 + 0x10),
                 (int *)(local_1070 + 0xc));
      Promise<NoCopy>::~Promise((Promise<NoCopy> *)local_1070);
      Array<kj::Promise<NoCopy>_>::~Array(&local_1088);
      local_105a = false;
    }
  }
  PromiseFulfillerPair<NoCopy>::~PromiseFulfillerPair((PromiseFulfillerPair<NoCopy> *)local_fb0);
  Promise<NoCopy>::~Promise((Promise<NoCopy> *)local_f90);
  WaitScope::~WaitScope((WaitScope *)&left_7);
  EventLoop::~EventLoop((EventLoop *)&waitScope_7.runningStacksPool);
  return;
}

Assistant:

TEST(Async, RaceSuccessful) {
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = newPromiseAndFulfiller<int>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = newPromiseAndFulfiller<int>(); // never fulfilled
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; }).eagerlyEvaluate(nullptr);

    EXPECT_EQ(456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    KJ_EXPECT_THROW(FAILED, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    struct NoCopy {
      int i;

      NoCopy(int i) : i(i) {}
      NoCopy(const NoCopy&) = delete;

      NoCopy(NoCopy&&) = default;
      NoCopy& operator=(NoCopy&&) = default;
    };

    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([]() -> kj::Promise<NoCopy> { return NoCopy(123); });
    kj::PromiseFulfillerPair<NoCopy> right = newPromiseAndFulfiller<NoCopy>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope).i);
  }
}